

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joint.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Joint::removeJoint(Joint *this,Scene *scene)

{
  bool bVar1;
  reference ppJVar2;
  iterator this_00;
  Joint *in_RSI;
  Joint *in_RDI;
  vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_> *joints;
  vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_> *kids;
  Joint *childJoint;
  iterator __end2;
  iterator __begin2;
  vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_> *__range2;
  vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
  *in_stack_ffffffffffffff28;
  vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_> *this_01;
  __normal_iterator<CMU462::DynamicScene::Joint_*const_*,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
  *in_stack_ffffffffffffff30;
  Joint *this_02;
  __normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
  in_stack_ffffffffffffff40;
  __normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
  in_stack_ffffffffffffff48;
  const_iterator in_stack_ffffffffffffff50;
  const_iterator in_stack_ffffffffffffff58;
  const_iterator __first;
  __normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
  local_20;
  Scene *scene_00;
  
  if (in_RDI != in_RDI->skeleton->root) {
    scene_00 = (Scene *)&in_RDI->kids;
    local_20._M_current =
         (Joint **)
         std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
         ::begin(in_stack_ffffffffffffff28);
    std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>::end
              (in_stack_ffffffffffffff28);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
                               *)in_stack_ffffffffffffff30,
                              (__normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
                               *)in_stack_ffffffffffffff28), bVar1) {
      ppJVar2 = __gnu_cxx::
                __normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
                ::operator*(&local_20);
      if (*ppJVar2 != in_RDI) {
        removeJoint(in_RSI,scene_00);
      }
      __gnu_cxx::
      __normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
      ::operator++(&local_20);
    }
    Scene::removeObject((Scene *)in_stack_ffffffffffffff48._M_current,
                        (SceneObject *)in_stack_ffffffffffffff40._M_current);
    this_01 = &in_RDI->parent->kids;
    std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>::
    begin(this_01);
    std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>::end
              (this_01);
    std::
    remove<__gnu_cxx::__normal_iterator<CMU462::DynamicScene::Joint**,std::vector<CMU462::DynamicScene::Joint*,std::allocator<CMU462::DynamicScene::Joint*>>>,CMU462::DynamicScene::Joint*>
              (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,(Joint **)in_RDI);
    __gnu_cxx::
    __normal_iterator<CMU462::DynamicScene::Joint*const*,std::vector<CMU462::DynamicScene::Joint*,std::allocator<CMU462::DynamicScene::Joint*>>>
    ::__normal_iterator<CMU462::DynamicScene::Joint**>
              (in_stack_ffffffffffffff30,
               (__normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
                *)this_01);
    std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>::end
              (this_01);
    __gnu_cxx::
    __normal_iterator<CMU462::DynamicScene::Joint*const*,std::vector<CMU462::DynamicScene::Joint*,std::allocator<CMU462::DynamicScene::Joint*>>>
    ::__normal_iterator<CMU462::DynamicScene::Joint**>
              (in_stack_ffffffffffffff30,
               (__normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
                *)this_01);
    std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>::
    erase((vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_> *)
          in_stack_ffffffffffffff48._M_current,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    this_02 = (Joint *)&in_RDI->skeleton->joints;
    std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>::
    begin(this_01);
    std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>::end
              (this_01);
    __first._M_current = (Joint **)in_RDI;
    std::
    remove<__gnu_cxx::__normal_iterator<CMU462::DynamicScene::Joint**,std::vector<CMU462::DynamicScene::Joint*,std::allocator<CMU462::DynamicScene::Joint*>>>,CMU462::DynamicScene::Joint*>
              (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,(Joint **)in_RDI);
    __gnu_cxx::
    __normal_iterator<CMU462::DynamicScene::Joint*const*,std::vector<CMU462::DynamicScene::Joint*,std::allocator<CMU462::DynamicScene::Joint*>>>
    ::__normal_iterator<CMU462::DynamicScene::Joint**>
              ((__normal_iterator<CMU462::DynamicScene::Joint_*const_*,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
                *)this_02,
               (__normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
                *)this_01);
    this_00 = std::
              vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
              ::end(this_01);
    __gnu_cxx::
    __normal_iterator<CMU462::DynamicScene::Joint*const*,std::vector<CMU462::DynamicScene::Joint*,std::allocator<CMU462::DynamicScene::Joint*>>>
    ::__normal_iterator<CMU462::DynamicScene::Joint**>
              ((__normal_iterator<CMU462::DynamicScene::Joint_*const_*,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
                *)this_02,
               (__normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
                *)this_01);
    std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>::
    erase((vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_> *)
          this_00._M_current,__first,in_stack_ffffffffffffff50);
    if (in_RDI != (Joint *)0x0) {
      ~Joint(this_02);
      operator_delete(in_RDI);
    }
  }
  return;
}

Assistant:

void Joint::removeJoint(Scene* scene) {
  if (this == skeleton->root) return;

  for (auto childJoint : kids) {
    if (childJoint != this) childJoint->removeJoint(scene);
  }

  scene->removeObject(this);

  auto& kids = parent->kids;
  kids.erase(std::remove(kids.begin(), kids.end(), this), kids.end());

  auto& joints = skeleton->joints;
  joints.erase(std::remove(joints.begin(), joints.end(), this), joints.end());

  delete this;
}